

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Add(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *this)

{
  Type *pTVar1;
  
  pTVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  return pTVar1;
}

Assistant:

inline Element* RepeatedPtrField<Element>::Add() {
  return RepeatedPtrFieldBase::Add<TypeHandler>();
}